

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::PropertyInstance::ParseValue(char **pCur,EDataType eType,ValueUnion *out)

{
  char *pcVar1;
  char cVar2;
  uint32_t uVar3;
  char cVar4;
  uint32_t uVar5;
  ai_real f;
  double d;
  float local_24;
  ValueUnion local_20;
  
  pcVar1 = *pCur;
  if (pcVar1 == (char *)0x0) {
    __assert_fail("__null != pCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x3ab,
                  "static bool Assimp::PLY::PropertyInstance::ParseValue(const char *&, PLY::EDataType, PLY::PropertyInstance::ValueUnion *)"
                 );
  }
  if (out != (ValueUnion *)0x0) {
    switch(eType) {
    case EDT_Char:
    case EDT_Short:
    case EDT_Int:
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + ((cVar2 - 0x2bU & 0xfd) == 0);
      cVar4 = *pcVar1;
      uVar3 = 0;
      if (0xf5 < (byte)(cVar4 - 0x3aU)) {
        uVar3 = 0;
        do {
          uVar3 = (uint)(byte)(cVar4 - 0x30) + uVar3 * 10;
          cVar4 = pcVar1[1];
          pcVar1 = pcVar1 + 1;
        } while (0xf5 < (byte)(cVar4 - 0x3aU));
      }
      *pCur = pcVar1;
      uVar5 = -uVar3;
      if (cVar2 != '-') {
        uVar5 = uVar3;
      }
      out->iUInt = uVar5;
      break;
    case EDT_UChar:
    case EDT_UShort:
    case EDT_UInt:
      cVar2 = *pcVar1;
      uVar3 = 0;
      if (0xf5 < (byte)(cVar2 - 0x3aU)) {
        uVar3 = 0;
        do {
          uVar3 = (uint)(byte)(cVar2 - 0x30) + uVar3 * 10;
          cVar2 = pcVar1[1];
          pcVar1 = pcVar1 + 1;
        } while (0xf5 < (byte)(cVar2 - 0x3aU));
      }
      *pCur = pcVar1;
      out->iUInt = uVar3;
      break;
    case EDT_Float:
      pcVar1 = fast_atoreal_move<float>(pcVar1,&local_24,true);
      *pCur = pcVar1;
      out->iUInt = (uint32_t)local_24;
      break;
    case EDT_Double:
      pcVar1 = fast_atoreal_move<double>(pcVar1,&local_20.fDouble,true);
      *pCur = pcVar1;
      *out = local_20;
      break;
    default:
      return false;
    }
    return true;
  }
  __assert_fail("__null != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                ,0x3ac,
                "static bool Assimp::PLY::PropertyInstance::ParseValue(const char *&, PLY::EDataType, PLY::PropertyInstance::ValueUnion *)"
               );
}

Assistant:

bool PLY::PropertyInstance::ParseValue(const char* &pCur,
  PLY::EDataType eType,
  PLY::PropertyInstance::ValueUnion* out)
{
  ai_assert(NULL != pCur);
  ai_assert(NULL != out);

  //calc element size
  bool ret = true;
  switch (eType)
  {
  case EDT_UInt:
  case EDT_UShort:
  case EDT_UChar:

    out->iUInt = (uint32_t)strtoul10(pCur, &pCur);
    break;

  case EDT_Int:
  case EDT_Short:
  case EDT_Char:

    out->iInt = (int32_t)strtol10(pCur, &pCur);
    break;

  case EDT_Float:
    // technically this should cast to float, but people tend to use float descriptors for double data
    // this is the best way to not risk losing precision on import and it doesn't hurt to do this
    ai_real f;
    pCur = fast_atoreal_move<ai_real>(pCur, f);
    out->fFloat = (ai_real)f;
    break;

  case EDT_Double:
    double d;
    pCur = fast_atoreal_move<double>(pCur, d);
    out->fDouble = (double)d;
    break;

  case EDT_INVALID:
  default:
    ret = false;
    break;
  }

  return ret;
}